

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

vm_obj_id_t __thiscall
CVmObjClass::find_mod_src_obj(CVmObjClass *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    uVar1 = *(uint *)(*(long *)((long)&((CVmObjPageEntry *)this)->ptr_ + 8) + 4);
    if (uVar1 != 0) {
      if (uVar1 == mod_obj) {
        return self;
      }
      iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar1 >> 0xc][uVar1 & 0xfff].ptr_ + 0x38))
                        (G_obj_table_X.pages_[uVar1 >> 0xc] + (uVar1 & 0xfff),mod_obj);
      if (iVar2 != 0) {
        return self;
      }
    }
    iVar2 = (**(code **)(*(long *)&((CVmObjPageEntry *)this)->ptr_ + 0x40))(this,self);
    if (iVar2 == 0) {
      return 0;
    }
    self = (**(code **)(*(long *)&((CVmObjPageEntry *)this)->ptr_ + 0x48))(this,self,0);
    if (self == 0) break;
    this = (CVmObjClass *)(G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff));
  }
  return 0;
}

Assistant:

vm_obj_id_t CVmObjClass::find_mod_src_obj(VMG_ vm_obj_id_t self,
                                          vm_obj_id_t mod_obj)
{
    vm_obj_id_t my_mod_obj;
    vm_obj_id_t sc;
    
    /* 
     *   Is this one of my modifier objects?  It is if it's my most
     *   specialized modifier object (i.e., get_mod_obj()), or if my most
     *   specialized modifier object descends from the given object. 
     */
    my_mod_obj = get_mod_obj();
    if (my_mod_obj != VM_INVALID_OBJ
        && (mod_obj == my_mod_obj
            || vm_objp(vmg_ my_mod_obj)->is_instance_of(vmg_ mod_obj)))
    {
        /* it's one of mine, so I'm the intrinsic class mod_obj modifies */
        return self;
    }

    /* 
     *   It's not one of mine, so check my superclasses recursively.  If we
     *   have no direct superclass, we've failed to find the object.  
     */
    if (get_superclass_count(vmg_ self) == 0
        || (sc = get_superclass(vmg_ self, 0)) == VM_INVALID_OBJ)
        return VM_INVALID_OBJ;
    
    /* ask the superclass to find the modifier */
    return ((CVmObjClass *)vm_objp(vmg_ sc))
        ->find_mod_src_obj(vmg_ sc, mod_obj);
}